

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testCaseStarting(XmlReporter *this,TestCaseInfo *testInfo)

{
  XmlWriter *this_00;
  int iVar1;
  uint64_t uVar2;
  allocator<char> local_e4;
  allocator<char> local_e3;
  allocator<char> local_e2;
  allocator<char> local_e1;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  LazyStat<Catch::TestCaseInfo>::operator=
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).currentTestCaseInfo,testInfo);
  this_00 = &this->m_xml;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"TestCase",&local_e1);
  XmlWriter::startElement(this_00,&local_40,Newline|Indent);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"name",&local_e2);
  trim(&local_80,&testInfo->name);
  XmlWriter::writeAttribute(this_00,&local_60,&local_80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"description",&local_e3);
  XmlWriter::writeAttribute(this_00,&local_a0,&testInfo->description);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"tags",&local_e4);
  TestCaseInfo::tagsAsString_abi_cxx11_(&local_e0,testInfo);
  XmlWriter::writeAttribute(this_00,&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  writeSourceInfo(this,&testInfo->lineInfo);
  iVar1 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar1 == 1) {
    uVar2 = std::chrono::_V2::system_clock::now();
    (this->m_testCaseTimer).m_nanoseconds = uVar2;
  }
  XmlWriter::ensureTagClosed(this_00);
  return;
}

Assistant:

void XmlReporter::testCaseStarting( TestCaseInfo const& testInfo ) {
        StreamingReporterBase::testCaseStarting(testInfo);
        m_xml.startElement( "TestCase" )
            .writeAttribute( "name", trim( testInfo.name ) )
            .writeAttribute( "description", testInfo.description )
            .writeAttribute( "tags", testInfo.tagsAsString() );

        writeSourceInfo( testInfo.lineInfo );

        if ( m_config->showDurations() == ShowDurations::Always )
            m_testCaseTimer.start();
        m_xml.ensureTagClosed();
    }